

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

Cnf_Dat_t * Acb_NtkWindow2Cnf(Acb_Ntk_t *p,Vec_Int_t *vWinObjs,int Pivot)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Vec_Int_t *p_00;
  Vec_Wec_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  int *piVar9;
  Vec_Int_t *pVVar10;
  Cnf_Dat_t *pCVar11;
  int **ppiVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  
  p_00 = Vec_IntAlloc(8);
  iVar2 = Abc_Var2Lit(Pivot,0);
  iVar3 = Vec_IntFind(vWinObjs,iVar2);
  iVar4 = Acb_NtkCountRoots(vWinObjs,iVar3);
  iVar2 = iVar3 + 1;
  iVar15 = vWinObjs->nSize - iVar2;
  iVar13 = vWinObjs->nSize + iVar4 + iVar15;
  p_01 = Acb_DeriveCnfForWindow(p,vWinObjs,iVar3);
  p_02 = Vec_IntAlloc(100);
  p_03 = Vec_IntAlloc(1000);
  for (iVar14 = 0; iVar14 < vWinObjs->nSize; iVar14 = iVar14 + 1) {
    iVar5 = Vec_IntEntry(vWinObjs,iVar14);
    iVar5 = Abc_Lit2Var(iVar5);
    iVar6 = Acb_ObjFunc(p,iVar5);
    if (iVar6 != -1) {
      __assert_fail("Acb_ObjFunc(p, i) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                    ,0x11b,"void Acb_ObjSetFunc(Acb_Ntk_t *, int, int)");
    }
    Vec_IntWriteEntry(&p->vObjFunc,iVar5,iVar14);
  }
  Vec_IntPush(p_02,p_03->nSize);
  for (iVar14 = 0; iVar5 = vWinObjs->nSize, iVar6 = iVar2, iVar14 < iVar5; iVar14 = iVar14 + 1) {
    iVar5 = Vec_IntEntry(vWinObjs,iVar14);
    iVar6 = Abc_LitIsCompl(iVar5);
    if ((iVar3 <= iVar14) || (iVar6 == 0)) {
      iVar5 = Abc_Lit2Var(iVar5);
      iVar6 = Acb_ObjIsCio(p,iVar5);
      if (iVar6 != 0) {
        __assert_fail("!Acb_ObjIsCio(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                      ,0xd5,"Cnf_Dat_t *Acb_NtkWindow2Cnf(Acb_Ntk_t *, Vec_Int_t *, int)");
      }
      p_00->nSize = 0;
      piVar9 = Acb_ObjFanins(p,iVar5);
      for (lVar17 = 0; lVar17 < *piVar9; lVar17 = lVar17 + 1) {
        iVar6 = Acb_ObjFunc(p,piVar9[lVar17 + 1]);
        Vec_IntPush(p_00,iVar6);
      }
      iVar6 = Acb_ObjFunc(p,iVar5);
      Vec_IntPush(p_00,iVar6);
      pVVar10 = Vec_WecEntry(p_01,iVar5);
      Acb_TranslateCnf(p_02,p_03,(Vec_Str_t *)pVVar10,p_00,-1);
    }
  }
  for (; iVar6 < iVar5; iVar6 = iVar6 + 1) {
    iVar14 = Vec_IntEntry(vWinObjs,iVar6);
    iVar14 = Abc_Lit2Var(iVar14);
    iVar5 = Acb_ObjIsCio(p,iVar14);
    if (iVar5 != 0) {
      __assert_fail("!Acb_ObjIsCio(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                    ,0xe2,"Cnf_Dat_t *Acb_NtkWindow2Cnf(Acb_Ntk_t *, Vec_Int_t *, int)");
    }
    p_00->nSize = 0;
    piVar9 = Acb_ObjFanins(p,iVar14);
    for (lVar17 = 0; lVar17 < *piVar9; lVar17 = lVar17 + 1) {
      iVar5 = piVar9[lVar17 + 1];
      iVar7 = Acb_ObjFunc(p,iVar5);
      iVar8 = Acb_ObjFunc(p,iVar5);
      iVar5 = iVar15;
      if (iVar8 <= iVar3) {
        iVar5 = 0;
      }
      Vec_IntPush(p_00,iVar5 + iVar7);
    }
    iVar5 = Acb_ObjFunc(p,iVar14);
    Vec_IntPush(p_00,iVar5 + iVar15);
    pVVar10 = Vec_WecEntry(p_01,iVar14);
    Acb_TranslateCnf(p_02,p_03,(Vec_Str_t *)pVVar10,p_00,iVar3);
    iVar5 = vWinObjs->nSize;
  }
  if (iVar4 < 1) {
    iVar2 = p_03->nSize;
  }
  else {
    iVar3 = iVar15 + iVar5;
    p_00->nSize = 0;
    for (; iVar2 < iVar5; iVar2 = iVar2 + 1) {
      iVar14 = Vec_IntEntry(vWinObjs,iVar2);
      iVar5 = Abc_LitIsCompl(iVar14);
      if (iVar5 != 0) {
        iVar14 = Abc_Lit2Var(iVar14);
        iVar5 = Acb_ObjFunc(p,iVar14);
        iVar5 = Abc_Var2Lit(iVar5,1);
        iVar6 = Acb_ObjFunc(p,iVar14);
        iVar6 = Abc_Var2Lit(iVar6 + iVar15,0);
        iVar7 = Abc_Var2Lit(iVar3,0);
        Vec_IntPushThree(p_03,iVar5,iVar6,iVar7);
        Vec_IntPush(p_02,p_03->nSize);
        iVar5 = Acb_ObjFunc(p,iVar14);
        iVar5 = Abc_Var2Lit(iVar5,0);
        iVar6 = Acb_ObjFunc(p,iVar14);
        iVar6 = Abc_Var2Lit(iVar6 + iVar15,1);
        iVar7 = Abc_Var2Lit(iVar3,0);
        Vec_IntPushThree(p_03,iVar5,iVar6,iVar7);
        Vec_IntPush(p_02,p_03->nSize);
        iVar5 = Acb_ObjFunc(p,iVar14);
        iVar5 = Abc_Var2Lit(iVar5,0);
        iVar6 = Acb_ObjFunc(p,iVar14);
        iVar6 = Abc_Var2Lit(iVar6 + iVar15,0);
        iVar7 = Abc_Var2Lit(iVar3,1);
        Vec_IntPushThree(p_03,iVar5,iVar6,iVar7);
        Vec_IntPush(p_02,p_03->nSize);
        iVar5 = Acb_ObjFunc(p,iVar14);
        iVar5 = Abc_Var2Lit(iVar5,1);
        iVar14 = Acb_ObjFunc(p,iVar14);
        iVar14 = Abc_Var2Lit(iVar14 + iVar15,1);
        iVar6 = Abc_Var2Lit(iVar3,1);
        Vec_IntPushThree(p_03,iVar5,iVar14,iVar6);
        Vec_IntPush(p_02,p_03->nSize);
        iVar14 = Abc_Var2Lit(iVar3,0);
        Vec_IntPush(p_00,iVar14);
        iVar3 = iVar3 + 1;
      }
      iVar5 = vWinObjs->nSize;
    }
    iVar14 = p_00->nSize;
    iVar15 = 0;
    iVar2 = 0;
    if (0 < iVar14) {
      iVar2 = iVar14;
    }
    for (; iVar2 != iVar15; iVar15 = iVar15 + 1) {
      iVar5 = Vec_IntEntry(p_00,iVar15);
      Vec_IntPush(p_03,iVar5);
    }
    iVar2 = p_03->nSize;
    Vec_IntPush(p_02,iVar2);
    if (iVar4 != iVar14) {
      __assert_fail("nRoots == Vec_IntSize(vFaninVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                    ,0x102,"Cnf_Dat_t *Acb_NtkWindow2Cnf(Acb_Ntk_t *, Vec_Int_t *, int)");
    }
    if (iVar3 != iVar13) {
      __assert_fail("nVars == nVarsAll",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                    ,0x103,"Cnf_Dat_t *Acb_NtkWindow2Cnf(Acb_Ntk_t *, Vec_Int_t *, int)");
    }
  }
  Vec_IntFree(p_00);
  pCVar11 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar11->nVars = iVar13;
  uVar1 = p_02->nSize;
  pCVar11->nClauses = uVar1 - 1;
  pCVar11->nLiterals = iVar2;
  ppiVar12 = (int **)malloc((long)(int)uVar1 << 3);
  pCVar11->pClauses = ppiVar12;
  piVar9 = p_03->pArray;
  p_03->nCap = 0;
  p_03->nSize = 0;
  p_03->pArray = (int *)0x0;
  *ppiVar12 = piVar9;
  uVar18 = 0;
  uVar16 = 0;
  if (0 < (int)uVar1) {
    uVar16 = (ulong)uVar1;
  }
  for (; uVar16 != uVar18; uVar18 = uVar18 + 1) {
    iVar2 = Vec_IntEntry(p_02,(int)uVar18);
    ppiVar12[uVar18] = *ppiVar12 + iVar2;
  }
  Vec_IntFree(p_02);
  Vec_IntFree(p_03);
  return pCVar11;
}

Assistant:

Cnf_Dat_t * Acb_NtkWindow2Cnf( Acb_Ntk_t * p, Vec_Int_t * vWinObjs, int Pivot )
{
    Cnf_Dat_t * pCnf;
    Vec_Int_t * vFaninVars = Vec_IntAlloc( 8 );
    int PivotVar = Vec_IntFind(vWinObjs, Abc_Var2Lit(Pivot, 0));
    int nRoots   = Acb_NtkCountRoots(vWinObjs, PivotVar);
    int TfoStart = PivotVar + 1;
    int nTfoSize = Vec_IntSize(vWinObjs) - TfoStart;
    int nVarsAll = Vec_IntSize(vWinObjs) + nTfoSize + nRoots;
    int i, k, iObj, iObjLit, iFanin, * pFanins, Entry;
    Vec_Wec_t * vCnfs = Acb_DeriveCnfForWindow( p, vWinObjs, PivotVar );
    Vec_Int_t * vClas = Vec_IntAlloc( 100 );
    Vec_Int_t * vLits = Vec_IntAlloc( 1000 );
    // mark new SAT variables
    Vec_IntForEachEntry( vWinObjs, iObj, i )
        Acb_ObjSetFunc( p, Abc_Lit2Var(iObj), i );
    // add clauses for all nodes
    Vec_IntPush( vClas, Vec_IntSize(vLits) );
    Vec_IntForEachEntry( vWinObjs, iObjLit, i )
    {
        if ( Abc_LitIsCompl(iObjLit) && i < PivotVar )
            continue;
        iObj = Abc_Lit2Var(iObjLit);
        assert( !Acb_ObjIsCio(p, iObj) );
        // collect SAT variables
        Vec_IntClear( vFaninVars );
        Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
            Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iFanin) );
        Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iObj) );
        // derive CNF for the node
        Acb_TranslateCnf( vClas, vLits, (Vec_Str_t *)Vec_WecEntry(vCnfs, iObj), vFaninVars, -1 );
    }
    // add second clauses for the TFO
    Vec_IntForEachEntryStart( vWinObjs, iObjLit, i, TfoStart )
    {
        iObj = Abc_Lit2Var(iObjLit);
        assert( !Acb_ObjIsCio(p, iObj) );
        // collect SAT variables
        Vec_IntClear( vFaninVars );
        Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
            Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iFanin) + (Acb_ObjFunc(p, iFanin) > PivotVar) * nTfoSize );
        Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iObj) + nTfoSize );
        // derive CNF for the node
        Acb_TranslateCnf( vClas, vLits, (Vec_Str_t *)Vec_WecEntry(vCnfs, iObj), vFaninVars, PivotVar );
    }
    if ( nRoots > 0 )
    {
        // create XOR clauses for the roots
        int nVars = Vec_IntSize(vWinObjs) + nTfoSize;
        Vec_IntClear( vFaninVars );
        Vec_IntForEachEntryStart( vWinObjs, iObjLit, i, TfoStart )
        {
            if ( !Abc_LitIsCompl(iObjLit) )
                continue;
            iObj = Abc_Lit2Var(iObjLit);
            // add clauses
            Vec_IntPushThree( vLits, Abc_Var2Lit(Acb_ObjFunc(p, iObj), 1), Abc_Var2Lit(Acb_ObjFunc(p, iObj) + nTfoSize, 0), Abc_Var2Lit(nVars, 0) );
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPushThree( vLits, Abc_Var2Lit(Acb_ObjFunc(p, iObj), 0), Abc_Var2Lit(Acb_ObjFunc(p, iObj) + nTfoSize, 1), Abc_Var2Lit(nVars, 0) );
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPushThree( vLits, Abc_Var2Lit(Acb_ObjFunc(p, iObj), 0), Abc_Var2Lit(Acb_ObjFunc(p, iObj) + nTfoSize, 0), Abc_Var2Lit(nVars, 1) );
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPushThree( vLits, Abc_Var2Lit(Acb_ObjFunc(p, iObj), 1), Abc_Var2Lit(Acb_ObjFunc(p, iObj) + nTfoSize, 1), Abc_Var2Lit(nVars, 1) );
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPush( vFaninVars, Abc_Var2Lit(nVars++, 0) );
        }
        Vec_IntAppend( vLits, vFaninVars );
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        assert( nRoots == Vec_IntSize(vFaninVars) );
        assert( nVars == nVarsAll );
    }
    Vec_IntFree( vFaninVars );
    // create CNF structure
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->nVars     = nVarsAll;
    pCnf->nClauses  = Vec_IntSize(vClas)-1;
    pCnf->nLiterals = Vec_IntSize(vLits);
    pCnf->pClauses  = ABC_ALLOC( int *, Vec_IntSize(vClas) );
    pCnf->pClauses[0] = Vec_IntReleaseArray(vLits);
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
    // cleanup
    Vec_IntFree( vClas );
    Vec_IntFree( vLits );
    //Cnf_DataPrint( pCnf, 1 );
    return pCnf;
}